

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void convergeephemerons(global_State *g)

{
  Table *pTVar1;
  bool bVar2;
  int iVar3;
  Table *h;
  GCObject *next;
  GCObject *w;
  int dir;
  int changed;
  global_State *g_local;
  
  w._0_4_ = 0;
  do {
    h = (Table *)g->ephemeron;
    g->ephemeron = (GCObject *)0x0;
    bVar2 = false;
    while (h != (Table *)0x0) {
      if (h->tt != '\x05') {
        __assert_fail("(w)->tt == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x311,"void convergeephemerons(global_State *)");
      }
      pTVar1 = (Table *)h->gclist;
      if ((h->marked & 0x18) != 0) {
        __assert_fail("!(((h)->marked) & (((1<<(3)) | (1<<(4)))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x313,"void convergeephemerons(global_State *)");
      }
      h->marked = h->marked | 0x20;
      iVar3 = traverseephemeron(g,h,(uint)w);
      h = pTVar1;
      if (iVar3 != 0) {
        propagateall(g);
        bVar2 = true;
      }
    }
    w._0_4_ = (uint)(((uint)w != 0 ^ 0xffU) & 1);
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

static void convergeephemerons (global_State *g) {
  int changed;
  int dir = 0;
  do {
    GCObject *w;
    GCObject *next = g->ephemeron;  /* get ephemeron list */
    g->ephemeron = NULL;  /* tables may return to this list when traversed */
    changed = 0;
    while ((w = next) != NULL) {  /* for each ephemeron table */
      Table *h = gco2t(w);
      next = h->gclist;  /* list is rebuilt during loop */
      nw2black(h);  /* out of the list (for now) */
      if (traverseephemeron(g, h, dir)) {  /* marked some value? */
        propagateall(g);  /* propagate changes */
        changed = 1;  /* will have to revisit all ephemeron tables */
      }
    }
    dir = !dir;  /* invert direction next time */
  } while (changed);  /* repeat until no more changes */
}